

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::
emplace_back<(anonymous_namespace)::Constructable&>
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,Constructable *args)

{
  ulong uVar1;
  ulong uVar2;
  Constructable *__result;
  reference extraout_RAX;
  reference extraout_RAX_00;
  reference pCVar3;
  Constructable *__result_00;
  ulong uVar4;
  Constructable *__last;
  Constructable *__first;
  Constructable *this_00;
  
  uVar2 = this->len;
  this_00 = this->data_ + uVar2;
  if (uVar2 == this->cap) {
    if (uVar2 == 0xfffffffffffffff) {
      detail::throwLengthError();
    }
    uVar4 = uVar2 + 1;
    uVar1 = uVar2 * 2;
    if (uVar4 <= uVar1 && uVar1 - uVar4 != 0) {
      uVar4 = uVar1;
    }
    if (0xfffffffffffffff - uVar2 < uVar2) {
      uVar4 = 0xfffffffffffffff;
    }
    __result = (Constructable *)operator_new(uVar4 * 8);
    anon_unknown.dwarf_965823::Constructable::Constructable(__result + uVar2,args);
    __first = this->data_;
    __last = __first + this->len;
    __result_00 = __result;
    if (__last != this_00) {
      std::
      uninitialized_move<(anonymous_namespace)::Constructable*,(anonymous_namespace)::Constructable*>
                (__first,this_00,__result);
      __last = this->data_ + this->len;
      __result_00 = __result + uVar2 + 1;
      __first = this_00;
    }
    std::
    uninitialized_move<(anonymous_namespace)::Constructable*,(anonymous_namespace)::Constructable*>
              (__first,__last,__result_00);
    cleanup(this,(EVP_PKEY_CTX *)__last);
    this->len = this->len + 1;
    this->cap = uVar4;
    this->data_ = __result;
    pCVar3 = extraout_RAX_00;
  }
  else {
    anon_unknown.dwarf_965823::Constructable::Constructable(this_00,args);
    this->len = this->len + 1;
    pCVar3 = extraout_RAX;
  }
  return pCVar3;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }